

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_normalize_var(secp256k1_fe *r)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t uVar7;
  
  secp256k1_fe_verify(r);
  uVar1 = (r->n[4] >> 0x30) * 0x1000003d1 + r->n[0];
  uVar2 = (uVar1 >> 0x34) + r->n[1];
  uVar1 = uVar1 & 0xfffffffffffff;
  uVar4 = (uVar2 >> 0x34) + r->n[2];
  uVar5 = (uVar4 >> 0x34) + r->n[3];
  uVar4 = uVar4 & 0xfffffffffffff;
  uVar7 = (uVar5 >> 0x34) + (r->n[4] & 0xffffffffffff);
  uVar3 = uVar2 & 0xfffffffffffff;
  uVar6 = uVar5 & 0xfffffffffffff;
  if (0xffffefffffc2e < uVar1 &&
      ((uVar4 & uVar2 & uVar5) == 0xfffffffffffff && uVar7 == 0xffffffffffff) || uVar7 >> 0x30 != 0)
  {
    uVar3 = uVar3 + (uVar1 + 0x1000003d1 >> 0x34);
    uVar4 = uVar4 + (uVar3 >> 0x34);
    uVar6 = uVar6 + (uVar4 >> 0x34);
    uVar2 = (uVar6 >> 0x34) + uVar7;
    if ((uVar2 & 0x3000000000000) != 0x1000000000000) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/field_5x52_impl.h"
              ,0x80,"test condition failed: t4 >> 48 == x");
      abort();
    }
    uVar6 = uVar6 & 0xfffffffffffff;
    uVar4 = uVar4 & 0xfffffffffffff;
    uVar3 = uVar3 & 0xfffffffffffff;
    uVar1 = uVar1 + 0x1000003d1 & 0xfffffffffffff;
    uVar7 = uVar2 & 0xffffffffffff;
  }
  r->n[0] = uVar1;
  r->n[1] = uVar3;
  r->n[2] = uVar4;
  r->n[3] = uVar6;
  r->n[4] = uVar7;
  r->magnitude = 1;
  r->normalized = 1;
  secp256k1_fe_verify(r);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_normalize_var(secp256k1_fe *r) {
    SECP256K1_FE_VERIFY(r);

    secp256k1_fe_impl_normalize_var(r);
    r->magnitude = 1;
    r->normalized = 1;

    SECP256K1_FE_VERIFY(r);
}